

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiIO::ImGuiIO(ImGuiIO *this)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar5;
  
  memset(this,0,0x1550);
  (this->DisplaySize).x = -1.0;
  (this->DisplaySize).y = -1.0;
  this->DeltaTime = 0.016666668;
  this->IniSavingRate = 5.0;
  this->IniFilename = "imgui.ini";
  this->LogFilename = "imgui_log.txt";
  this->MouseDoubleClickTime = 0.3;
  this->MouseDoubleClickMaxDist = 6.0;
  this->KeyMap[0] = -1;
  this->KeyMap[1] = -1;
  this->KeyMap[2] = -1;
  this->KeyMap[3] = -1;
  this->KeyMap[4] = -1;
  this->KeyMap[5] = -1;
  this->KeyMap[6] = -1;
  this->KeyMap[7] = -1;
  this->KeyMap[8] = -1;
  this->KeyMap[9] = -1;
  this->KeyMap[10] = -1;
  this->KeyMap[0xb] = -1;
  this->KeyMap[0xc] = -1;
  this->KeyMap[0xd] = -1;
  this->KeyMap[0xe] = -1;
  this->KeyMap[0xf] = -1;
  this->KeyMap[0x10] = -1;
  this->KeyMap[0x11] = -1;
  this->KeyMap[0x12] = -1;
  this->KeyMap[0x13] = -1;
  this->KeyMap[0x14] = -1;
  this->KeyRepeatDelay = 0.25;
  this->KeyRepeatRate = 0.05;
  this->UserData = (void *)0x0;
  this->Fonts = (ImFontAtlas *)0x0;
  this->FontGlobalScale = 1.0;
  this->FontAllowUserScaling = false;
  (this->DisplayFramebufferScale).x = 1.0;
  (this->DisplayFramebufferScale).y = 1.0;
  this->ConfigMacOSXBehaviors = false;
  this->ConfigInputTextCursorBlink = true;
  this->ConfigWindowsResizeFromEdges = true;
  this->BackendPlatformUserData = (void *)0x0;
  this->BackendRendererUserData = (void *)0x0;
  this->BackendPlatformName = (char *)0x0;
  this->BackendRendererName = (char *)0x0;
  this->BackendLanguageUserData = (void *)0x0;
  this->GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;
  this->SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
  this->ImeSetInputScreenPosFn = ImeSetInputScreenPosFn_DefaultImpl;
  (this->MousePos).x = -3.4028235e+38;
  (this->MousePos).y = -3.4028235e+38;
  (this->MousePosPrev).x = -3.4028235e+38;
  (this->MousePosPrev).y = -3.4028235e+38;
  this->MouseDragThreshold = 6.0;
  lVar3 = -5;
  do {
    (&this->MouseDragMaxDistanceAbs[0].x)[lVar3] = -1.0;
    this->MouseDownDurationPrev[lVar3] = -1.0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0);
  lVar3 = -0x200;
  do {
    pfVar1 = this->NavInputsDownDuration + lVar3;
    pfVar1[0] = -1.0;
    pfVar1[1] = -1.0;
    pfVar1[2] = -1.0;
    pfVar1[3] = -1.0;
    pfVar1 = this->KeysDownDurationPrev + lVar3;
    pfVar1[0] = -1.0;
    pfVar1[1] = -1.0;
    pfVar1[2] = -1.0;
    auVar2 = _DAT_00166e10;
    pfVar1[3] = -1.0;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0);
  lVar3 = 0;
  auVar4 = _DAT_00166df0;
  auVar6 = _DAT_00166e00;
  do {
    auVar7 = auVar6 ^ auVar2;
    if (auVar7._4_4_ == -0x80000000 && auVar7._0_4_ < -0x7fffffea) {
      this->NavInputsDownDuration[lVar3] = -1.0;
      this->NavInputsDownDuration[lVar3 + 1] = -1.0;
    }
    auVar7 = auVar4 ^ auVar2;
    if (auVar7._4_4_ == -0x80000000 && auVar7._0_4_ < -0x7fffffea) {
      this->NavInputsDownDuration[lVar3 + 2] = -1.0;
      this->NavInputsDownDuration[lVar3 + 3] = -1.0;
    }
    lVar3 = lVar3 + 4;
    lVar5 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 4;
    auVar6._8_8_ = lVar5 + 4;
    lVar5 = auVar4._8_8_;
    auVar4._0_8_ = auVar4._0_8_ + 4;
    auVar4._8_8_ = lVar5 + 4;
  } while (lVar3 != 0x18);
  return;
}

Assistant:

ImGuiIO::ImGuiIO()
{
    // Most fields are initialized with zero
    memset(this, 0, sizeof(*this));

    // Settings
    ConfigFlags = ImGuiConfigFlags_None;
    BackendFlags = ImGuiBackendFlags_None;
    DisplaySize = ImVec2(-1.0f, -1.0f);
    DeltaTime = 1.0f/60.0f;
    IniSavingRate = 5.0f;
    IniFilename = "imgui.ini";
    LogFilename = "imgui_log.txt";
    MouseDoubleClickTime = 0.30f;
    MouseDoubleClickMaxDist = 6.0f;
    for (int i = 0; i < ImGuiKey_COUNT; i++)
        KeyMap[i] = -1;
    KeyRepeatDelay = 0.250f;
    KeyRepeatRate = 0.050f;
    UserData = NULL;

    Fonts = NULL;
    FontGlobalScale = 1.0f;
    FontDefault = NULL;
    FontAllowUserScaling = false;
    DisplayFramebufferScale = ImVec2(1.0f, 1.0f);

    // Miscellaneous options
    MouseDrawCursor = false;
#ifdef __APPLE__
    ConfigMacOSXBehaviors = true;  // Set Mac OS X style defaults based on __APPLE__ compile time flag
#else
    ConfigMacOSXBehaviors = false;
#endif
    ConfigInputTextCursorBlink = true;
    ConfigWindowsResizeFromEdges = true;
    ConfigWindowsMoveFromTitleBarOnly = false;

    // Platform Functions
    BackendPlatformName = BackendRendererName = NULL;
    BackendPlatformUserData = BackendRendererUserData = BackendLanguageUserData = NULL;
    GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;   // Platform dependent default implementations
    SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
    ClipboardUserData = NULL;
    ImeSetInputScreenPosFn = ImeSetInputScreenPosFn_DefaultImpl;
    ImeWindowHandle = NULL;

#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    RenderDrawListsFn = NULL;
#endif

    // Input (NB: we already have memset zero the entire structure!)
    MousePos = ImVec2(-FLT_MAX, -FLT_MAX);
    MousePosPrev = ImVec2(-FLT_MAX, -FLT_MAX);
    MouseDragThreshold = 6.0f;
    for (int i = 0; i < IM_ARRAYSIZE(MouseDownDuration); i++) MouseDownDuration[i] = MouseDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(KeysDownDuration); i++) KeysDownDuration[i]  = KeysDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(NavInputsDownDuration); i++) NavInputsDownDuration[i] = -1.0f;
}